

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::MultiNode<QString,_RCCFileInfo_*>::MultiNode
          (MultiNode<QString,_RCCFileInfo_*> *this,MultiNode<QString,_RCCFileInfo_*> *other)

{
  void *pvVar1;
  long in_RSI;
  QString *in_RDI;
  Chain *chain;
  Chain **e;
  Chain *c;
  QString *in_stack_ffffffffffffffc8;
  QString *local_20;
  undefined8 *local_18;
  
  QString::QString(in_RDI,in_stack_ffffffffffffffc8);
  local_20 = in_RDI + 1;
  for (local_18 = *(undefined8 **)(in_RSI + 0x18); local_18 != (undefined8 *)0x0;
      local_18 = (undefined8 *)local_18[1]) {
    pvVar1 = operator_new(0x10);
    *(undefined8 *)pvVar1 = *local_18;
    *(undefined8 *)((long)pvVar1 + 8) = 0;
    (local_20->d).d = pvVar1;
    local_20 = (QString *)((long)pvVar1 + 8);
  }
  return;
}

Assistant:

MultiNode(const MultiNode &other)
        : key(other.key)
    {
        Chain *c = other.value;
        Chain **e = &value;
        while (c) {
            Chain *chain = new Chain{ c->value, nullptr };
            *e = chain;
            e = &chain->next;
            c = c->next;
        }
    }